

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.hpp
# Opt level: O3

void __thiscall
cs::compiler_type::build_line
          (compiler_type *this,deque<char,_std::allocator<char>_> *buff,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *ast,size_t line_num,charset encoding)

{
  _Elt_pointer pdVar1;
  _Elt_pointer pdVar2;
  _Map_pointer ppdVar3;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *line;
  _Elt_pointer line_00;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> tokens;
  token_base *local_90;
  _Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> local_88;
  
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::_M_initialize_map
            (&local_88,0);
  process_char_buff(this,buff,
                    (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_88,encoding
                   );
  local_90 = (token_base *)token_base::operator_new((token_base *)0x10,(size_t)buff);
  local_90->line_num = line_num;
  local_90->_vptr_token_base = (_func_int **)&PTR__token_base_00332bc0;
  if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<cs::token_base*,std::allocator<cs::token_base*>>::_M_push_back_aux<cs::token_base*>
              ((deque<cs::token_base*,std::allocator<cs::token_base*>> *)&local_88,&local_90);
  }
  else {
    *local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = local_90;
    local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
         local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
  }
  process_token_buff(this,(deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_88,
                     ast);
  line_00 = (ast->
            super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
            )._M_impl.super__Deque_impl_data._M_start._M_cur;
  pdVar1 = (ast->
           super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
           )._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (line_00 != pdVar1) {
    pdVar2 = (ast->
             super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
             )._M_impl.super__Deque_impl_data._M_start._M_last;
    ppdVar3 = (ast->
              super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
              )._M_impl.super__Deque_impl_data._M_start._M_node;
    do {
      process_line(this,line_00);
      line_00 = line_00 + 1;
      if (line_00 == pdVar2) {
        line_00 = ppdVar3[1];
        ppdVar3 = ppdVar3 + 1;
        pdVar2 = line_00 + 6;
      }
    } while (line_00 != pdVar1);
  }
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base(&local_88);
  return;
}

Assistant:

void
		build_line(const std::deque<char> &buff, std::deque<std::deque<token_base *>> &ast, std::size_t line_num = 1,
		           charset encoding = charset::utf8)
		{
			std::deque<token_base *> tokens;
			process_char_buff(buff, tokens, encoding);
			tokens.push_back(new token_endline(line_num));
			process_token_buff(tokens, ast);
			for (auto &line: ast)
				process_line(line);
		}